

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaEra2.c
# Opt level: O3

int Gia_ManAreDepth(Gia_ManAre_t *p,int iState)

{
  uint **ppuVar1;
  int iVar2;
  uint *puVar3;
  
  ppuVar1 = p->ppStas;
  iVar2 = 0;
  for (puVar3 = (uint *)((long)(int)((iState & 0xfffffU) * p->nSize) * 4 +
                        *(long *)((long)ppuVar1 + (ulong)((uint)iState >> 0x11 & 0x3ff8)));
      *ppuVar1 != puVar3;
      puVar3 = (uint *)((long)(int)((*puVar3 & 0xfffff) * p->nSize) * 4 +
                       *(long *)((long)ppuVar1 + (ulong)(*puVar3 >> 0x11 & 0x3ff8)))) {
    iVar2 = iVar2 + 1;
  }
  return iVar2;
}

Assistant:

int Gia_ManAreDepth( Gia_ManAre_t * p, int iState )
{
    Gia_StaAre_t * pSta;
    int Counter = 0;
    for ( pSta = Gia_ManAreStaInt(p, iState); Gia_StaIsGood(p, pSta); pSta = Gia_StaPrev(p, pSta) )
        Counter++;
    return Counter;
}